

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O2

void insert_timer(level *lev,timer_element *gnu)

{
  timer_element *ptVar1;
  timer_element *ptVar2;
  timer_element *ptVar3;
  
  ptVar2 = (timer_element *)&lev->lev_timers;
  ptVar1 = (timer_element *)0x0;
  do {
    ptVar3 = ptVar1;
    ptVar2 = ptVar2->next;
    if (ptVar2 == (timer_element *)0x0) break;
    ptVar1 = ptVar2;
  } while (ptVar2->timeout < gnu->timeout);
  gnu->next = ptVar2;
  ptVar2 = (timer_element *)&lev->lev_timers;
  if (ptVar3 != (timer_element *)0x0) {
    ptVar2 = ptVar3;
  }
  ptVar2->next = gnu;
  return;
}

Assistant:

static void insert_timer(struct level *lev, timer_element *gnu)
{
    timer_element *curr, *prev;

    for (prev = 0, curr = lev->lev_timers; curr; prev = curr, curr = curr->next)
	if (curr->timeout >= gnu->timeout) break;

    gnu->next = curr;
    if (prev)
	prev->next = gnu;
    else
	lev->lev_timers = gnu;
}